

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void __thiscall Fl_Widget_Type::write_color(Fl_Widget_Type *this,char *field,Fl_Color color)

{
  int iVar1;
  char *pcVar2;
  char *local_50;
  char *local_48;
  char *var;
  char *color_name;
  Fl_Color color_local;
  char *field_local;
  Fl_Widget_Type *this_local;
  
  var = (char *)0x0;
  switch(color) {
  case 0:
    var = "FL_FOREGROUND_COLOR";
    break;
  case 7:
    var = "FL_BACKGROUND2_COLOR";
    break;
  case 8:
    var = "FL_INACTIVE_COLOR";
    break;
  case 0xf:
    var = "FL_SELECTION_COLOR";
    break;
  case 0x20:
    var = "FL_GRAY0";
    break;
  case 0x27:
    var = "FL_DARK3";
    break;
  case 0x2d:
    var = "FL_DARK2";
    break;
  case 0x2f:
    var = "FL_DARK1";
    break;
  case 0x31:
    var = "FL_BACKGROUND_COLOR";
    break;
  case 0x32:
    var = "FL_LIGHT1";
    break;
  case 0x34:
    var = "FL_LIGHT2";
    break;
  case 0x36:
    var = "FL_LIGHT3";
    break;
  case 0x38:
    var = "FL_BLACK";
    break;
  case 0x3c:
    var = "FL_DARK_GREEN";
    break;
  case 0x3f:
    var = "FL_GREEN";
    break;
  case 0x48:
    var = "FL_DARK_RED";
    break;
  case 0x4c:
    var = "FL_DARK_YELLOW";
    break;
  case 0x58:
    var = "FL_RED";
    break;
  case 0x5f:
    var = "FL_YELLOW";
    break;
  case 0x88:
    var = "FL_DARK_BLUE";
    break;
  case 0x8c:
    var = "FL_DARK_CYAN";
    break;
  case 0x98:
    var = "FL_DARK_MAGENTA";
    break;
  case 0xd8:
    var = "FL_BLUE";
    break;
  case 0xdf:
    var = "FL_CYAN";
    break;
  case 0xf8:
    var = "FL_MAGENTA";
    break;
  case 0xff:
    var = "FL_WHITE";
  }
  iVar1 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x26])();
  if (iVar1 == 0) {
    pcVar2 = Fl_Type::name(&this->super_Fl_Type);
    if (pcVar2 == (char *)0x0) {
      local_50 = "o";
    }
    else {
      local_50 = Fl_Type::name(&this->super_Fl_Type);
    }
    local_48 = local_50;
  }
  else {
    local_48 = "this";
  }
  if (var == (char *)0x0) {
    pcVar2 = indent();
    write_c("%s%s->%s((Fl_Color)%d);\n",pcVar2,local_48,field,(ulong)color);
  }
  else {
    pcVar2 = indent();
    write_c("%s%s->%s(%s);\n",pcVar2,local_48,field,var);
  }
  return;
}

Assistant:

void Fl_Widget_Type::write_color(const char* field, Fl_Color color) {
  const char* color_name = 0;
  switch (color) {
  case FL_FOREGROUND_COLOR:	color_name = "FL_FOREGROUND_COLOR";	break;
  case FL_BACKGROUND2_COLOR:	color_name = "FL_BACKGROUND2_COLOR";	break;
  case FL_INACTIVE_COLOR:	color_name = "FL_INACTIVE_COLOR";	break;
  case FL_SELECTION_COLOR:	color_name = "FL_SELECTION_COLOR";	break;
  case FL_GRAY0:		color_name = "FL_GRAY0";		break;
  case FL_DARK3:		color_name = "FL_DARK3";		break;
  case FL_DARK2:		color_name = "FL_DARK2";		break;
  case FL_DARK1:		color_name = "FL_DARK1";		break;
  case FL_BACKGROUND_COLOR:	color_name = "FL_BACKGROUND_COLOR";	break;
  case FL_LIGHT1:		color_name = "FL_LIGHT1";		break;
  case FL_LIGHT2:		color_name = "FL_LIGHT2";		break;
  case FL_LIGHT3:		color_name = "FL_LIGHT3";		break;
  case FL_BLACK:		color_name = "FL_BLACK";		break;
  case FL_RED:			color_name = "FL_RED";			break;
  case FL_GREEN:		color_name = "FL_GREEN";		break;
  case FL_YELLOW:		color_name = "FL_YELLOW";		break;
  case FL_BLUE:			color_name = "FL_BLUE";			break;
  case FL_MAGENTA:		color_name = "FL_MAGENTA";		break;
  case FL_CYAN:			color_name = "FL_CYAN";			break;
  case FL_DARK_RED:		color_name = "FL_DARK_RED";		break;
  case FL_DARK_GREEN:		color_name = "FL_DARK_GREEN";		break;
  case FL_DARK_YELLOW:		color_name = "FL_DARK_YELLOW";		break;
  case FL_DARK_BLUE:		color_name = "FL_DARK_BLUE";		break;
  case FL_DARK_MAGENTA:		color_name = "FL_DARK_MAGENTA";		break;
  case FL_DARK_CYAN:		color_name = "FL_DARK_CYAN";		break;
  case FL_WHITE:		color_name = "FL_WHITE";		break;
  }
  const char *var = is_class() ? "this" : name() ? name() : "o";
  if (color_name) {
    write_c("%s%s->%s(%s);\n", indent(), var, field, color_name);
  } else {
    write_c("%s%s->%s((Fl_Color)%d);\n", indent(), var, field, color);
  }
}